

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ModuleEnumerator.cpp
# Opt level: O0

ModuleIterator * __thiscall axl::spy::ModuleIterator::operator++(ModuleIterator *this,int param_2)

{
  ModuleIterator *in_RDI;
  ModuleIterator *it;
  ModuleIterator *in_stack_ffffffffffffffb8;
  ModuleIterator *this_00;
  
  this_00 = in_RDI;
  ModuleIterator(in_RDI,in_stack_ffffffffffffffb8);
  operator++(this_00);
  return in_RDI;
}

Assistant:

ModuleIterator
ModuleIterator::operator ++ (int) {
	ModuleIterator it = *this;
	operator ++ ();
	return it;
}